

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerCheckIsFuncObj(Lowerer *this,Instr *instr,bool checkFuncInfo)

{
  BailOutKind bailOutKind_00;
  Opnd *pOVar1;
  RegOpnd *funcOpnd_00;
  BailOutInfo *bailOutInfo_00;
  AddrOpnd *inlinedFuncInfo;
  Instr *local_40;
  Instr *lastInstr;
  BailOutInfo *bailOutInfo;
  BailOutKind bailOutKind;
  RegOpnd *funcOpnd;
  bool checkFuncInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar1 = IR::Instr::GetSrc1(instr);
  funcOpnd_00 = IR::Opnd::AsRegOpnd(pOVar1);
  bailOutKind_00 = IR::Instr::GetBailOutKind(instr);
  bailOutInfo_00 = IR::Instr::GetBailOutInfo(instr);
  InsertObjectCheck(this,funcOpnd_00,instr,bailOutKind_00,bailOutInfo_00);
  local_40 = InsertFunctionTypeIdCheck(this,funcOpnd_00,instr,bailOutKind_00,bailOutInfo_00);
  if (checkFuncInfo) {
    pOVar1 = IR::Instr::GetSrc2(instr);
    inlinedFuncInfo = IR::Opnd::AsAddrOpnd(pOVar1);
    local_40 = InsertFunctionInfoCheck
                         (this,funcOpnd_00,instr,inlinedFuncInfo,bailOutKind_00,bailOutInfo_00);
    IR::Instr::SetByteCodeOffset(local_40,instr);
  }
  if (bailOutInfo_00->bailOutInstr == instr) {
    bailOutInfo_00->bailOutInstr = local_40;
  }
  instr->field_0x38 = instr->field_0x38 & 0xef;
  instr->field_0x38 = instr->field_0x38 & 0xbf;
  IR::Instr::Remove(instr);
  return local_40;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckIsFuncObj(IR::Instr *instr, bool checkFuncInfo)
{
    // The CheckIsFuncObj instr and CheckFuncInfo instr (checkFuncInfo = true) are used to
    // generate bailout instrs that type check a function (and can also check the func info).
    // Rather than creating these bailout instrs in Inline, they are created in Lower because 
    // CheckIsFuncObj and CheckFuncInfo instrs can be hoisted outside of loops and thus the
    // bailout instrs created can exist outside of loops.

    IR::RegOpnd *funcOpnd = instr->GetSrc1()->AsRegOpnd();
    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    BailOutInfo *bailOutInfo = instr->GetBailOutInfo();

    // Check that the property is an object.
    InsertObjectCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    // Check that the object is a function with the correct type ID.
    IR::Instr *lastInstr = InsertFunctionTypeIdCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    if (checkFuncInfo)
    {
        // Check that the function body matches the func info.
        lastInstr = InsertFunctionInfoCheck(
            funcOpnd, instr, instr->GetSrc2()->AsAddrOpnd(), bailOutKind, bailOutInfo);
        lastInstr->SetByteCodeOffset(instr);
    }

    if (bailOutInfo->bailOutInstr == instr)
    {
        // bailOutInstr is currently instr. By changing bailOutInstr to point to lastInstr, the next
        // instruction to be lowered (lastInstr) will create the bailout target. This is necessary in
        // cases where instr does not have a shared bailout (ex: instr was not hoisted outside of a loop).
        bailOutInfo->bailOutInstr = lastInstr;
    }

    // the CheckFunctionEntryPoint instr exists in order to create the instrs above. It does not have
    // any other purpose and thus it is removed. The instr's BailOutInfo continues to be used and thus
    // must not be deleted. Flags are turned off to stop Remove() from deleting instr's BailOutInfo.
    instr->hasBailOutInfo = false;
    instr->hasAuxBailOut = false;
    instr->Remove();

    return lastInstr;
}